

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O3

wchar_t hist_command(EditLine *el,wchar_t argc,wchar_t **argv)

{
  void *pvVar1;
  int iVar2;
  wchar_t wVar3;
  ulong uVar4;
  char *__s;
  size_t sVar5;
  char *mbdst;
  wchar_t *pwVar6;
  HistoryW *h;
  char *__ptr;
  HistEventW ev;
  ulong local_58;
  HistEventW local_40;
  
  pvVar1 = (el->el_history).ref;
  if (pvVar1 == (void *)0x0) {
    return L'\xffffffff';
  }
  if ((argc != L'\x01') && (iVar2 = wcscmp(argv[1],anon_var_dwarf_536f + 6), iVar2 != 0)) {
    if (argc != L'\x03') {
      return L'\xffffffff';
    }
    uVar4 = wcstol(argv[2],(wchar_t **)0x0,0);
    pwVar6 = argv[1];
    iVar2 = wcscmp(pwVar6,anon_var_dwarf_40e9);
    if (iVar2 == 0) {
      h = (HistoryW *)(el->el_history).ref;
      wVar3 = L'\x01';
    }
    else {
      iVar2 = wcscmp(pwVar6,anon_var_dwarf_40f3);
      if (iVar2 != 0) {
        return L'\xffffffff';
      }
      h = (HistoryW *)(el->el_history).ref;
      wVar3 = L'\x14';
    }
    wVar3 = history_w(h,&local_40,wVar3,uVar4 & 0xffffffff);
    return wVar3;
  }
  if ((el->el_flags & L'@') == L'\0') {
    mbdst = (char *)0x0;
    wVar3 = (*(el->el_history).fun)(pvVar1,&(el->el_history).ev,L'\x04',0);
    if (wVar3 == L'\xffffffff') goto LAB_00108f78;
    pwVar6 = (el->el_history).ev.str;
  }
  else {
    pwVar6 = hist_convert(el,L'\x04',(void *)0x0);
  }
  if (pwVar6 == (wchar_t *)0x0) {
    mbdst = (char *)0x0;
  }
  else {
    uVar4 = 1;
    local_58 = 0;
    __ptr = (char *)0x0;
    do {
      __s = ct_encode_string(pwVar6,&el->el_scratch);
      sVar5 = strlen(__s);
      if (sVar5 == 0) {
        sVar5 = 0;
      }
      else if (__s[sVar5 - 1] == '\n') {
        __s[sVar5 - 1] = '\0';
        sVar5 = sVar5 - 1;
      }
      mbdst = __ptr;
      if (local_58 <= sVar5 * 4 + 1) {
        local_58 = sVar5 * 4 + 0x401;
        mbdst = (char *)realloc(__ptr,local_58);
        if (mbdst == (char *)0x0) {
          free(__ptr);
          return L'\xffffffff';
        }
      }
      strvis(mbdst,__s,L'\x10');
      fprintf((FILE *)el->el_outfile,"%d\t%s\n",uVar4,mbdst);
      if ((el->el_flags & L'@') == L'\0') {
        wVar3 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x05',0);
        if (wVar3 == L'\xffffffff') break;
        pwVar6 = (el->el_history).ev.str;
      }
      else {
        pwVar6 = hist_convert(el,L'\x05',(void *)0x0);
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      __ptr = mbdst;
    } while (pwVar6 != (wchar_t *)0x0);
  }
LAB_00108f78:
  free(mbdst);
  return L'\0';
}

Assistant:

libedit_private int
hist_command(EditLine *el, int argc, const wchar_t **argv)
{
	const wchar_t *str;
	int num;
	HistEventW ev;

	if (el->el_history.ref == NULL)
		return -1;

	if (argc == 1 || wcscmp(argv[1], L"list") == 0) {
		size_t maxlen = 0;
		char *buf = NULL;
		int hno = 1;
		 /* List history entries */

		for (str = HIST_LAST(el); str != NULL; str = HIST_PREV(el)) {
			char *ptr =
			    ct_encode_string(str, &el->el_scratch);
			size_t len = strlen(ptr);
			if (len > 0 && ptr[len - 1] == '\n') 
				ptr[--len] = '\0';
			len = len * 4 + 1;
			if (len >= maxlen) {
				maxlen = len + 1024;
				char *nbuf = el_realloc(buf, maxlen);
				if (nbuf == NULL) {
					el_free(buf);
					return -1;
				}
				buf = nbuf;
			}
			strvis(buf, ptr, VIS_NL);
			(void) fprintf(el->el_outfile, "%d\t%s\n",
			    hno++, buf);
		}
		el_free(buf);
		return 0;
	}

	if (argc != 3)
		return -1;

	num = (int)wcstol(argv[2], NULL, 0);

	if (wcscmp(argv[1], L"size") == 0)
		return history_w(el->el_history.ref, &ev, H_SETSIZE, num);

	if (wcscmp(argv[1], L"unique") == 0)
		return history_w(el->el_history.ref, &ev, H_SETUNIQUE, num);

	return -1;
}